

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_tests.cpp
# Opt level: O3

void __thiscall key_tests::key_ellswift::test_method(key_ellswift *this)

{
  iterator in_R8;
  iterator pvVar1;
  iterator in_R9;
  iterator pvVar2;
  long lVar3;
  long *plVar4;
  long in_FS_OFFSET;
  const_string file;
  Span<std::byte> output;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  Span<const_std::byte> ent32_00;
  CPubKey decoded_pubkey;
  EllSwiftPubKey ellswift;
  uint256 ent32;
  check_type cVar5;
  char *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  lazy_ostream local_240;
  undefined1 *local_230;
  char **local_228;
  assertion_result local_220;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  undefined1 local_1b8 [8];
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  shared_count asStack_198 [7];
  undefined1 local_160 [24];
  EllSwiftPubKey *local_148;
  char *local_118;
  char *local_110;
  byte local_d8 [32];
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  long *local_58 [2];
  long local_48 [3];
  
  local_48[2] = *(long *)(in_FS_OFFSET + 0x28);
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b8,strSecret1_abi_cxx11_._M_dataplus._M_p,
             strSecret1_abi_cxx11_._M_dataplus._M_p + strSecret1_abi_cxx11_._M_string_length);
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_98,strSecret2_abi_cxx11_._M_dataplus._M_p,
             strSecret2_abi_cxx11_._M_dataplus._M_p + strSecret2_abi_cxx11_._M_string_length);
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_78,strSecret1C_abi_cxx11_._M_dataplus._M_p,
             strSecret1C_abi_cxx11_._M_dataplus._M_p + strSecret1C_abi_cxx11_._M_string_length);
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,strSecret2C_abi_cxx11_._M_dataplus._M_p,
             strSecret2C_abi_cxx11_._M_dataplus._M_p + strSecret2C_abi_cxx11_._M_string_length);
  lVar3 = 0;
  do {
    DecodeSecret((string *)local_1b8);
    local_1c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_tests.cpp"
    ;
    local_1c0 = "";
    local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x155;
    file.m_begin = (iterator)&local_1c8;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1d8,msg);
    local_1a8._M_local_buf[0] =
         (_Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>)local_1b0._M_head_impl !=
         (_Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>)0x0;
    local_1a8._8_8_ = 0;
    asStack_198[0].pi_ = (sp_counted_base *)0x0;
    local_118 = "key.IsValid()";
    local_110 = "";
    local_160[8] = false;
    local_160._0_8_ = &PTR__lazy_ostream_01389048;
    local_160._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_1e8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_tests.cpp"
    ;
    local_1e0 = "";
    pvVar1 = (iterator)0x1;
    pvVar2 = (iterator)0x0;
    local_148 = (EllSwiftPubKey *)&local_118;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_1a8,(lazy_ostream *)local_160,1,0,WARN,_cVar5,
               (size_t)&local_1e8,0x155);
    boost::detail::shared_count::~shared_count(asStack_198);
    local_d8[0x10] = 0;
    local_d8[0x11] = 0;
    local_d8[0x12] = 0;
    local_d8[0x13] = 0;
    local_d8[0x14] = 0;
    local_d8[0x15] = 0;
    local_d8[0x16] = 0;
    local_d8[0x17] = 0;
    local_d8[0x18] = 0;
    local_d8[0x19] = 0;
    local_d8[0x1a] = 0;
    local_d8[0x1b] = 0;
    local_d8[0x1c] = 0;
    local_d8[0x1d] = 0;
    local_d8[0x1e] = 0;
    local_d8[0x1f] = 0;
    local_d8[0] = 0;
    local_d8[1] = 0;
    local_d8[2] = 0;
    local_d8[3] = 0;
    local_d8[4] = 0;
    local_d8[5] = 0;
    local_d8[6] = 0;
    local_d8[7] = 0;
    local_d8[8] = 0;
    local_d8[9] = 0;
    local_d8[10] = 0;
    local_d8[0xb] = 0;
    local_d8[0xc] = 0;
    local_d8[0xd] = 0;
    local_d8[0xe] = 0;
    local_d8[0xf] = 0;
    output.m_size = 0x20;
    output.m_data = local_d8;
    FastRandomContext::fillrand(&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_rng,output);
    ent32_00.m_size = 0x20;
    ent32_00.m_data = local_d8;
    CKey::EllSwiftCreate((EllSwiftPubKey *)&local_118,(CKey *)local_1b8,ent32_00);
    EllSwiftPubKey::Decode((CPubKey *)local_160,(EllSwiftPubKey *)&local_118);
    if (local_1b8[0] == false) {
      CPubKey::Decompress((CPubKey *)local_160);
    }
    local_1f8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_tests.cpp"
    ;
    local_1f0 = "";
    local_208 = &boost::unit_test::basic_cstring<char_const>::null;
    local_200 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x161;
    file_00.m_begin = (iterator)&local_1f8;
    msg_00.m_end = pvVar2;
    msg_00.m_begin = pvVar1;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_208,
               msg_00);
    CKey::GetPubKey((CPubKey *)&local_1a8,(CKey *)local_1b8);
    local_220.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)::operator==((CPubKey *)&local_1a8,(CPubKey *)local_160);
    local_220.m_message.px = (element_type *)0x0;
    local_220.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_250 = "key.GetPubKey() == decoded_pubkey";
    local_248 = "";
    local_240.m_empty = false;
    local_240._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
    local_230 = boost::unit_test::lazy_ostream::inst;
    local_228 = &local_250;
    local_260 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_tests.cpp"
    ;
    local_258 = "";
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_220,&local_240,1,0,WARN,_cVar5,(size_t)&local_260,0x161);
    boost::detail::shared_count::~shared_count(&local_220.m_message.pn);
    if ((_Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
         )local_1b0._M_head_impl != (array<unsigned_char,_32UL> *)0x0) {
      SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_1b0,
                 local_1b0._M_head_impl);
    }
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0x80);
  lVar3 = -0x80;
  plVar4 = local_48;
  do {
    if (plVar4 != (long *)plVar4[-2]) {
      operator_delete((long *)plVar4[-2],*plVar4 + 1);
    }
    plVar4 = plVar4 + -4;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_48[2]) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(key_ellswift)
{
    for (const auto& secret : {strSecret1, strSecret2, strSecret1C, strSecret2C}) {
        CKey key = DecodeSecret(secret);
        BOOST_CHECK(key.IsValid());

        uint256 ent32 = m_rng.rand256();
        auto ellswift = key.EllSwiftCreate(AsBytes(Span{ent32}));

        CPubKey decoded_pubkey = ellswift.Decode();
        if (!key.IsCompressed()) {
            // The decoding constructor returns a compressed pubkey. If the
            // original was uncompressed, we must decompress the decoded one
            // to compare.
            decoded_pubkey.Decompress();
        }
        BOOST_CHECK(key.GetPubKey() == decoded_pubkey);
    }
}